

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O0

int esMain(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  int in_EDI;
  err_t code;
  char **in_stack_00000028;
  int in_stack_00000030;
  char **in_stack_00000838;
  int in_stack_00000840;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  err_t local_4;
  
  if (in_EDI < 2) {
    local_4 = esUsage();
  }
  else {
    pcVar2 = (char *)(in_RSI + 8);
    iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      local_4 = esPrint(in_stack_00000030,in_stack_00000028);
    }
    else {
      iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        local_4 = esRead(in_stack_00000840,in_stack_00000838);
      }
      else {
        local_4 = 0x259;
      }
    }
    if (local_4 != 0) {
      pcVar2 = errMsg(local_4);
      printf("bee2cmd/%s: %s\n","es",pcVar2);
    }
  }
  return local_4;
}

Assistant:

int esMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return esUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "print"))
		code = esPrint(argc - 1, argv + 1);
	else if (strEq(argv[0], "read"))
		code = esRead(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return (int)code;
}